

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scl.c
# Opt level: O0

int Scl_CommandUpsize(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint uVar2;
  Abc_Ntk_t *pNtk_00;
  Abc_Ntk_t *pAVar3;
  char *pcVar4;
  int c;
  Abc_Ntk_t *pNtk;
  SC_SizePars *pPars;
  uint local_60;
  SC_SizePars Pars;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  Pars._52_8_ = argv;
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  memset((SC_SizePars *)((long)&pPars + 4),0,0x3c);
  pPars._4_4_ = 1000;
  local_60 = 0x32;
  Pars.nIters = 1;
  Pars.nIterNoChange = 10;
  Pars.Window = 1000;
  Pars.Ratio = 0;
  Pars.Notches = 0;
  Pars.DelayUser = 0;
  Pars.DelayGap = 0;
  Pars.TimeOut = 0;
  Pars.BuffTreeEst = 1;
  Pars.fUseDept = 0;
  Pars.BypassFreq = 0;
  Pars.fDumpStats = 0;
  Pars.fUseWireLoads = 0;
  Extra_UtilGetoptReset();
LAB_004f0d96:
  do {
    iVar1 = Extra_UtilGetopt(argc,(char **)Pars._52_8_,"IJWRNDGTXBcsdvwh");
    if (iVar1 == -1) {
      pAVar3 = Abc_FrameReadNtk(pAbc);
      if (pAVar3 == (Abc_Ntk_t *)0x0) {
        fprintf((FILE *)pAbc->Err,"There is no current network.\n");
        return 1;
      }
      pAVar3 = Abc_FrameReadNtk(pAbc);
      iVar1 = Abc_NtkHasMapping(pAVar3);
      if (iVar1 == 0) {
        fprintf((FILE *)pAbc->Err,"The current network is not mapped.\n");
        return 1;
      }
      pAVar3 = Abc_FrameReadNtk(pAbc);
      iVar1 = Abc_SclCheckNtk(pAVar3,0);
      if (iVar1 == 0) {
        fprintf((FILE *)pAbc->Err,"The current network is not in a topo order (run \"topo\").\n");
        return 1;
      }
      if ((pAbc->pLibScl != (void *)0x0) && (iVar1 = Abc_SclHasDelayInfo(pAbc->pLibScl), iVar1 != 0)
         ) {
        Abc_SclUpsizePerform((SC_Lib *)pAbc->pLibScl,pNtk_00,(SC_SizePars *)((long)&pPars + 4));
        return 0;
      }
      Abc_Print(-1,"Library delay info is not available.\n");
      return 1;
    }
    switch(iVar1) {
    case 0x42:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-B\" should be followed by a positive integer.\n");
        goto LAB_004f1383;
      }
      Pars.TimeOut = atoi(*(char **)(Pars._52_8_ + (long)globalUtilOptind * 8));
      uVar2 = Pars.TimeOut;
      break;
    default:
      goto LAB_004f1383;
    case 0x44:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-D\" should be followed by a positive integer.\n");
        goto LAB_004f1383;
      }
      Pars.Ratio = atoi(*(char **)(Pars._52_8_ + (long)globalUtilOptind * 8));
      uVar2 = Pars.Ratio;
      break;
    case 0x47:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-G\" should be followed by a positive integer.\n");
        goto LAB_004f1383;
      }
      Pars.Notches = atoi(*(char **)(Pars._52_8_ + (long)globalUtilOptind * 8));
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_004f0d96;
    case 0x49:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-I\" should be followed by a positive integer.\n");
        goto LAB_004f1383;
      }
      pPars._4_4_ = atoi(*(char **)(Pars._52_8_ + (long)globalUtilOptind * 8));
      uVar2 = pPars._4_4_;
      break;
    case 0x4a:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-J\" should be followed by a positive integer.\n");
        goto LAB_004f1383;
      }
      local_60 = atoi(*(char **)(Pars._52_8_ + (long)globalUtilOptind * 8));
      uVar2 = local_60;
      break;
    case 0x4e:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-N\" should be followed by a positive integer.\n");
        goto LAB_004f1383;
      }
      Pars.Window = atoi(*(char **)(Pars._52_8_ + (long)globalUtilOptind * 8));
      uVar2 = Pars.Window;
      break;
    case 0x52:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-R\" should be followed by a positive integer.\n");
        goto LAB_004f1383;
      }
      Pars.nIterNoChange = atoi(*(char **)(Pars._52_8_ + (long)globalUtilOptind * 8));
      uVar2 = Pars.nIterNoChange;
      break;
    case 0x54:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-T\" should be followed by a positive integer.\n");
        goto LAB_004f1383;
      }
      Pars.DelayUser = atoi(*(char **)(Pars._52_8_ + (long)globalUtilOptind * 8));
      uVar2 = Pars.DelayUser;
      break;
    case 0x57:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-W\" should be followed by a positive integer.\n");
        goto LAB_004f1383;
      }
      Pars.nIters = atoi(*(char **)(Pars._52_8_ + (long)globalUtilOptind * 8));
      uVar2 = Pars.nIters;
      break;
    case 0x58:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-X\" should be followed by a positive integer.\n");
        goto LAB_004f1383;
      }
      Pars.DelayGap = atoi(*(char **)(Pars._52_8_ + (long)globalUtilOptind * 8));
      uVar2 = Pars.DelayGap;
      break;
    case 99:
      Pars.fUseDept = Pars.fUseDept ^ 1;
      goto LAB_004f0d96;
    case 100:
      Pars.BypassFreq = Pars.BypassFreq ^ 1;
      goto LAB_004f0d96;
    case 0x68:
      goto LAB_004f1383;
    case 0x73:
      Pars.BuffTreeEst = Pars.BuffTreeEst ^ 1;
      goto LAB_004f0d96;
    case 0x76:
      Pars.fDumpStats = Pars.fDumpStats ^ 1;
      goto LAB_004f0d96;
    case 0x77:
      Pars.fUseWireLoads = Pars.fUseWireLoads ^ 1;
      goto LAB_004f0d96;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)uVar2 < 0) {
LAB_004f1383:
      fprintf((FILE *)pAbc->Err,"usage: upsize [-IJWRNDGTXB num] [-csdvwh]\n");
      fprintf((FILE *)pAbc->Err,
              "\t           selectively increases gate sizes on the critical path\n");
      fprintf((FILE *)pAbc->Err,
              "\t-I <num> : the number of upsizing iterations to perform [default = %d]\n",
              (ulong)pPars._4_4_);
      fprintf((FILE *)pAbc->Err,
              "\t-J <num> : the number of iterations without improvement to stop [default = %d]\n",
              (ulong)local_60);
      fprintf((FILE *)pAbc->Err,
              "\t-W <num> : delay window (in percent) of near-critical COs [default = %d]\n",
              (ulong)(uint)Pars.nIters);
      fprintf((FILE *)pAbc->Err,
              "\t-R <num> : ratio of critical nodes (in percent) to update [default = %d]\n",
              (ulong)(uint)Pars.nIterNoChange);
      fprintf((FILE *)pAbc->Err,
              "\t-N <num> : limit on discrete upsizing steps at a node [default = %d]\n",
              (ulong)(uint)Pars.Window);
      fprintf((FILE *)pAbc->Err,
              "\t-D <num> : delay target set by the user, in picoseconds [default = %d]\n",
              (ulong)(uint)Pars.Ratio);
      fprintf((FILE *)pAbc->Err,
              "\t-G <num> : delay gap during updating, in picoseconds [default = %d]\n",
              (ulong)(uint)Pars.Notches);
      fprintf((FILE *)pAbc->Err,"\t-T <num> : approximate timeout in seconds [default = %d]\n",
              (ulong)(uint)Pars.DelayUser);
      fprintf((FILE *)pAbc->Err,"\t-X <num> : ratio for buffer tree estimation [default = %d]\n",
              (ulong)(uint)Pars.DelayGap);
      fprintf((FILE *)pAbc->Err,"\t-B <num> : frequency of bypass transforms [default = %d]\n",
              (ulong)(uint)Pars.TimeOut);
      pcVar4 = "no";
      if (Pars.fUseDept != 0) {
        pcVar4 = "yes";
      }
      fprintf((FILE *)pAbc->Err,"\t-c       : toggle using wire-loads if specified [default = %s]\n"
              ,pcVar4);
      pcVar4 = "no";
      if (Pars.BuffTreeEst != 0) {
        pcVar4 = "yes";
      }
      fprintf((FILE *)pAbc->Err,
              "\t-s       : toggle using slack based on departure times [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (Pars.BypassFreq != 0) {
        pcVar4 = "yes";
      }
      fprintf((FILE *)pAbc->Err,
              "\t-d       : toggle dumping statistics into a file [default = %s]\n",pcVar4);
      pcVar4 = "no";
      if (Pars.fDumpStats != 0) {
        pcVar4 = "yes";
      }
      fprintf((FILE *)pAbc->Err,"\t-v       : toggle printing verbose information [default = %s]\n",
              pcVar4);
      pcVar4 = "no";
      if (Pars.fUseWireLoads != 0) {
        pcVar4 = "yes";
      }
      fprintf((FILE *)pAbc->Err,
              "\t-w       : toggle printing more verbose information [default = %s]\n",pcVar4);
      fprintf((FILE *)pAbc->Err,"\t-h       : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Scl_CommandUpsize( Abc_Frame_t * pAbc, int argc, char **argv )
{
    SC_SizePars Pars, * pPars = &Pars;
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    memset( pPars, 0, sizeof(SC_SizePars) );
    pPars->nIters        = 1000;
    pPars->nIterNoChange =   50;
    pPars->Window        =    1;
    pPars->Ratio         =   10;
    pPars->Notches       = 1000;
    pPars->DelayUser     =    0;
    pPars->DelayGap      =    0;
    pPars->TimeOut       =    0;
    pPars->BuffTreeEst   =    0;
    pPars->BypassFreq    =    0;
    pPars->fUseDept      =    1;
    pPars->fUseWireLoads =    0;
    pPars->fDumpStats    =    0;
    pPars->fVerbose      =    0;
    pPars->fVeryVerbose  =    0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "IJWRNDGTXBcsdvwh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'I':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-I\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nIters = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nIters < 0 ) 
                goto usage;
            break;
        case 'J':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-J\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->nIterNoChange = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nIterNoChange < 0 ) 
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->Window = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->Window < 0 ) 
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->Ratio = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->Ratio < 0 ) 
                goto usage;
            break;
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->Notches = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->Notches < 0 ) 
                goto usage;
            break;
        case 'D':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-D\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->DelayUser = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->DelayUser < 0 ) 
                goto usage;
            break;
        case 'G':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-G\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->DelayGap = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->TimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->TimeOut < 0 ) 
                goto usage;
            break;
        case 'X':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-X\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->BuffTreeEst = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->BuffTreeEst < 0 ) 
                goto usage;
            break;
        case 'B':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-B\" should be followed by a positive integer.\n" );
                goto usage;
            }
            pPars->BypassFreq = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->BypassFreq < 0 ) 
                goto usage;
            break;
        case 'c':
            pPars->fUseWireLoads ^= 1;
            break;
        case 's':
            pPars->fUseDept ^= 1;
            break;
        case 'd':
            pPars->fDumpStats ^= 1;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'w':
            pPars->fVeryVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( Abc_FrameReadNtk(pAbc) == NULL )
    {
        fprintf( pAbc->Err, "There is no current network.\n" );
        return 1;
    }
    if ( !Abc_NtkHasMapping(Abc_FrameReadNtk(pAbc)) )
    {
        fprintf( pAbc->Err, "The current network is not mapped.\n" );
        return 1;
    }
    if ( !Abc_SclCheckNtk(Abc_FrameReadNtk(pAbc), 0) )
    {
        fprintf( pAbc->Err, "The current network is not in a topo order (run \"topo\").\n" );
        return 1;
    }
    if ( !pAbc->pLibScl || !Abc_SclHasDelayInfo(pAbc->pLibScl) )
    {
        Abc_Print( -1, "Library delay info is not available.\n" );
        return 1;
    }

    Abc_SclUpsizePerform( (SC_Lib *)pAbc->pLibScl, pNtk, pPars );
    return 0;

usage:
    fprintf( pAbc->Err, "usage: upsize [-IJWRNDGTXB num] [-csdvwh]\n" );
    fprintf( pAbc->Err, "\t           selectively increases gate sizes on the critical path\n" );
    fprintf( pAbc->Err, "\t-I <num> : the number of upsizing iterations to perform [default = %d]\n", pPars->nIters );
    fprintf( pAbc->Err, "\t-J <num> : the number of iterations without improvement to stop [default = %d]\n", pPars->nIterNoChange );
    fprintf( pAbc->Err, "\t-W <num> : delay window (in percent) of near-critical COs [default = %d]\n", pPars->Window );
    fprintf( pAbc->Err, "\t-R <num> : ratio of critical nodes (in percent) to update [default = %d]\n", pPars->Ratio );
    fprintf( pAbc->Err, "\t-N <num> : limit on discrete upsizing steps at a node [default = %d]\n", pPars->Notches );
    fprintf( pAbc->Err, "\t-D <num> : delay target set by the user, in picoseconds [default = %d]\n", pPars->DelayUser );
    fprintf( pAbc->Err, "\t-G <num> : delay gap during updating, in picoseconds [default = %d]\n", pPars->DelayGap );
    fprintf( pAbc->Err, "\t-T <num> : approximate timeout in seconds [default = %d]\n", pPars->TimeOut );
    fprintf( pAbc->Err, "\t-X <num> : ratio for buffer tree estimation [default = %d]\n", pPars->BuffTreeEst );
    fprintf( pAbc->Err, "\t-B <num> : frequency of bypass transforms [default = %d]\n", pPars->BypassFreq );
    fprintf( pAbc->Err, "\t-c       : toggle using wire-loads if specified [default = %s]\n", pPars->fUseWireLoads? "yes": "no" );
    fprintf( pAbc->Err, "\t-s       : toggle using slack based on departure times [default = %s]\n", pPars->fUseDept? "yes": "no" );
    fprintf( pAbc->Err, "\t-d       : toggle dumping statistics into a file [default = %s]\n", pPars->fDumpStats? "yes": "no" );
    fprintf( pAbc->Err, "\t-v       : toggle printing verbose information [default = %s]\n", pPars->fVerbose? "yes": "no" );
    fprintf( pAbc->Err, "\t-w       : toggle printing more verbose information [default = %s]\n", pPars->fVeryVerbose? "yes": "no" );
    fprintf( pAbc->Err, "\t-h       : print the command usage\n");
    return 1;
}